

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flstring.c
# Opt level: O1

size_t fl_strlcpy(char *dst,char *src,size_t size)

{
  size_t __n;
  
  __n = strlen(src);
  if (size - 1 <= __n) {
    __n = size - 1;
  }
  memcpy(dst,src,__n);
  dst[__n] = '\0';
  return __n;
}

Assistant:

size_t				/* O - Length of string */
fl_strlcpy(char       *dst,	/* O - Destination string */
           const char *src,	/* I - Source string */
	   size_t      size) {	/* I - Size of destination string buffer */
  size_t	srclen;		/* Length of source string */


 /*
  * Figure out how much room is needed...
  */

  size --;

  srclen = strlen(src);

 /*
  * Copy the appropriate amount...
  */

  if (srclen > size) srclen = size;

  memcpy(dst, src, srclen);
  dst[srclen] = '\0';

  return (srclen);
}